

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

int nghttp2_stream_dep_add_subtree(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  int iVar1;
  
  dep_stream->sum_dep_weight = dep_stream->sum_dep_weight + stream->weight;
  if (dep_stream->dep_next == (nghttp2_stream *)0x0) {
    dep_stream->dep_next = stream;
    stream->dep_prev = dep_stream;
  }
  else {
    insert_link_dep(dep_stream,stream);
  }
  if ((((stream->item != (nghttp2_outbound_item *)0x0) && ((stream->flags & 0xc) == 0)) ||
      (iVar1 = nghttp2_pq_empty(&stream->obq), iVar1 == 0)) &&
     (iVar1 = stream_obq_push(dep_stream,stream), iVar1 != 0)) {
    return iVar1;
  }
  return 0;
}

Assistant:

int nghttp2_stream_dep_add_subtree(nghttp2_stream *dep_stream,
                                   nghttp2_stream *stream) {
  int rv;

  DEBUGF("stream: dep_add_subtree dep_stream(%p)=%d stream(%p)=%d\n",
         dep_stream, dep_stream->stream_id, stream, stream->stream_id);

  dep_stream->sum_dep_weight += stream->weight;

  if (dep_stream->dep_next) {
    insert_link_dep(dep_stream, stream);
  } else {
    link_dep(dep_stream, stream);
  }

  if (stream_subtree_active(stream)) {
    rv = stream_obq_push(dep_stream, stream);
    if (rv != 0) {
      return rv;
    }
  }

  validate_tree(dep_stream);

  return 0;
}